

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstToYaml.cpp
# Opt level: O2

void MyCompiler::Util::processAst<MyCompiler::Program>
               (Program *ast,int level,
               vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *items,string *name)

{
  Block *ast_00;
  int iVar1;
  allocator local_4d;
  int local_4c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_4c = level;
  std::operator+(&local_48,name,":");
  std::
  vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>::
  emplace_back<int&,std::__cxx11::string>
            ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
              *)items,&local_4c,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  iVar1 = local_4c;
  ast_00 = (ast->pBlock).super___shared_ptr<MyCompiler::Block,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string((string *)&local_48,"block",&local_4d);
  processAst<MyCompiler::Block>(ast_00,iVar1 + 1,items,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void MyCompiler::Util::processAst<MyCompiler::Program>(
        Program &ast, int level,
        std::vector<std::pair<int, std::string>> &items, const std::string &name)
{
    items.emplace_back(level, name + ":");
    processAst(*ast.pBlock, level + 1, items, "block");
}